

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_accent_phrase.c
# Opt level: O0

void njd_set_accent_phrase(NJD *njd)

{
  int iVar1;
  char *pcVar2;
  long *in_RDI;
  NJDNode *node;
  NJDNode *local_10;
  
  if ((in_RDI != (long *)0x0) && (*in_RDI != 0)) {
    for (local_10 = *(NJDNode **)(*in_RDI + 0x70); local_10 != (NJDNode *)0x0;
        local_10 = local_10->next) {
      iVar1 = NJDNode_get_chain_flag(local_10);
      if (iVar1 < 0) {
        NJDNode_set_chain_flag(local_10,1);
        pcVar2 = NJDNode_get_pos(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(local_10,1);
          }
        }
        pcVar2 = NJDNode_get_pos(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b520c);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(local_10,0);
          }
        }
        pcVar2 = NJDNode_get_pos(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(local_10->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b5222);
          if (iVar1 == 0) {
            pcVar2 = NJDNode_get_pos(local_10);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
            if (iVar1 == 0) {
              NJDNode_set_chain_flag(local_10,0);
            }
          }
        }
        pcVar2 = NJDNode_get_pos(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b5858 + 3);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b520c);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(local_10,0);
          }
          else {
            pcVar2 = NJDNode_get_pos(local_10);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
            if (iVar1 == 0) {
              NJDNode_set_chain_flag(local_10,0);
            }
          }
        }
        pcVar2 = NJDNode_get_pos(local_10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b5242);
        if (iVar1 == 0) {
LAB_00184815:
          NJDNode_set_chain_flag(local_10,0);
        }
        else {
          pcVar2 = NJDNode_get_pos(local_10->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b5242);
          if (iVar1 == 0) goto LAB_00184815;
          pcVar2 = NJDNode_get_pos(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b524c);
          if (iVar1 == 0) goto LAB_00184815;
          pcVar2 = NJDNode_get_pos(local_10->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b524c);
          if (iVar1 == 0) goto LAB_00184815;
          pcVar2 = NJDNode_get_pos(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b5256);
          if (iVar1 == 0) goto LAB_00184815;
          pcVar2 = NJDNode_get_pos(local_10->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b5256);
          if (iVar1 == 0) goto LAB_00184815;
        }
        pcVar2 = NJDNode_get_pos(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(local_10->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b2d35);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(local_10,0);
          }
        }
        pcVar2 = NJDNode_get_pos(local_10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b2d35);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(local_10,0);
          }
        }
        pcVar2 = NJDNode_get_pos(local_10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b6aa0 + 6);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(local_10,1);
        }
        pcVar2 = NJDNode_get_pos(local_10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b65c7 + 10);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(local_10,1);
        }
        pcVar2 = NJDNode_get_pos(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b6aa0 + 6);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b6aa0 + 6);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(local_10);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_b65c7 + 10);
            if (iVar1 != 0) {
              NJDNode_set_chain_flag(local_10,0);
            }
          }
        }
        pcVar2 = NJDNode_get_pos(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b65c7 + 10);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b6aa0 + 6);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(local_10);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_b65c7 + 10);
            if (iVar1 != 0) {
              NJDNode_set_chain_flag(local_10,0);
            }
          }
        }
        pcVar2 = NJDNode_get_pos_group1(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b528a);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(local_10,0);
          }
        }
        pcVar2 = NJDNode_get_pos(local_10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b520c);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b67f7 + 7);
          if (iVar1 == 0) {
            pcVar2 = NJDNode_get_pos(local_10->prev);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_b5858 + 3);
            if (iVar1 == 0) {
              pcVar2 = NJDNode_get_cform(local_10->prev);
              iVar1 = strtopcmp(pcVar2,anon_var_dwarf_b529e);
              if (iVar1 != -1) {
                NJDNode_set_chain_flag(local_10,1);
              }
            }
            else {
              pcVar2 = NJDNode_get_pos(local_10->prev);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_b520c);
              if (iVar1 == 0) {
                pcVar2 = NJDNode_get_cform(local_10->prev);
                iVar1 = strtopcmp(pcVar2,anon_var_dwarf_b529e);
                if (iVar1 != -1) {
                  NJDNode_set_chain_flag(local_10,1);
                }
              }
              else {
                pcVar2 = NJDNode_get_pos(local_10->prev);
                iVar1 = strcmp(pcVar2,anon_var_dwarf_b65c7 + 10);
                if (iVar1 == 0) {
                  pcVar2 = NJDNode_get_pos_group1(local_10->prev);
                  iVar1 = strcmp(pcVar2,anon_var_dwarf_b65db + 7);
                  if (iVar1 == 0) {
                    pcVar2 = NJDNode_get_string(local_10->prev);
                    iVar1 = strcmp(pcVar2,anon_var_dwarf_b3a47 + 6);
                    if (iVar1 == 0) {
                      NJDNode_set_chain_flag(local_10,1);
                    }
                    else {
                      pcVar2 = NJDNode_get_string(local_10->prev);
                      iVar1 = strcmp(pcVar2,anon_var_dwarf_b2335);
                      if (iVar1 == 0) {
                        NJDNode_set_chain_flag(local_10,1);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        pcVar2 = NJDNode_get_pos(local_10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b5858 + 3);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group1(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b67f7 + 7);
          if (iVar1 == 0) {
            pcVar2 = NJDNode_get_pos(local_10->prev);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_b5858 + 3);
            if (iVar1 == 0) {
              pcVar2 = NJDNode_get_cform(local_10->prev);
              iVar1 = strtopcmp(pcVar2,anon_var_dwarf_b529e);
              if (iVar1 != -1) {
                NJDNode_set_chain_flag(local_10,1);
              }
            }
            else {
              pcVar2 = NJDNode_get_pos(local_10->prev);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
              if (iVar1 == 0) {
                pcVar2 = NJDNode_get_pos_group1(local_10->prev);
                iVar1 = strcmp(pcVar2,anon_var_dwarf_b66ef + 7);
                if (iVar1 == 0) {
                  NJDNode_set_chain_flag(local_10,1);
                }
              }
            }
          }
        }
        pcVar2 = NJDNode_get_pos(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b5858 + 3);
          if (iVar1 != 0) {
            pcVar2 = NJDNode_get_pos(local_10);
            iVar1 = strcmp(pcVar2,anon_var_dwarf_b520c);
            if (iVar1 != 0) {
              pcVar2 = NJDNode_get_pos_group1(local_10);
              iVar1 = strcmp(pcVar2,anon_var_dwarf_b5222);
              if (iVar1 != 0) goto LAB_00184d69;
            }
          }
          NJDNode_set_chain_flag(local_10,0);
        }
LAB_00184d69:
        pcVar2 = NJDNode_get_pos(local_10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b1891);
        if (iVar1 == 0) {
LAB_00184da9:
          NJDNode_set_chain_flag(local_10,0);
        }
        else {
          pcVar2 = NJDNode_get_pos(local_10->prev);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b1891);
          if (iVar1 == 0) goto LAB_00184da9;
        }
        pcVar2 = NJDNode_get_pos(local_10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b52e6);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(local_10,0);
        }
        pcVar2 = NJDNode_get_pos_group3(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b52f0);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(local_10,0);
          }
        }
        pcVar2 = NJDNode_get_pos(local_10->prev);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b6741 + 0xd);
        if (iVar1 == 0) {
          pcVar2 = NJDNode_get_pos_group3(local_10);
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b674b + 3);
          if (iVar1 == 0) {
            NJDNode_set_chain_flag(local_10,0);
          }
        }
        pcVar2 = NJDNode_get_pos_group1(local_10);
        iVar1 = strcmp(pcVar2,anon_var_dwarf_b528a);
        if (iVar1 == 0) {
          NJDNode_set_chain_flag(local_10,1);
        }
      }
    }
  }
  return;
}

Assistant:

void njd_set_accent_phrase(NJD * njd)
{
   NJDNode *node;

   if (njd == NULL || njd->head == NULL)
      return;

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (NJDNode_get_chain_flag(node) < 0) {
         /* Rule 01 */
         NJDNode_set_chain_flag(node, 1);

         /* Rule 02 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 1);

         /* Rule 03 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 04 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp
                (NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUDOUSHI_GOKAN) == 0)
               if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
                  NJDNode_set_chain_flag(node, 0);

         /* Rule 05 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
               NJDNode_set_chain_flag(node, 0);
            else if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);
         }

         /* Rule 06 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_FUKUSHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_FUKUSHI) == 0
             || strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_SETSUZOKUSHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_SETSUZOKUSHI) == 0
             || strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_RENTAISHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_RENTAISHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 07 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_FUKUSHI_KANOU)
                == 0)
               NJDNode_set_chain_flag(node, 0);
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_FUKUSHI_KANOU) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 08 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) == 0)
            NJDNode_set_chain_flag(node, 1);
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) == 0)
            NJDNode_set_chain_flag(node, 1);

         /* Rule 09 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JODOUSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) != 0 &&
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) != 0)
               NJDNode_set_chain_flag(node, 0);
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JOSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) != 0 &&
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) != 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 10 */
         if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_SETSUBI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 11 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_HIJIRITSU) == 0) {
               if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUSHI)
                          == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JOSHI) == 0) {
                  if (strcmp
                      (NJDNode_get_pos_group1(node->prev),
                       NJD_SET_ACCENT_PHRASE_SETSUZOKUJOSHI) == 0) {
                     if (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_PHRASE_TE) == 0)
                        NJDNode_set_chain_flag(node, 1);
                     else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_PHRASE_DE) == 0)
                        NJDNode_set_chain_flag(node, 1);
                  }
               }
            }

         /* Rule 12 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_HIJIRITSU) == 0) {
               if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0) {
                  if (strcmp
                      (NJDNode_get_pos_group1(node->prev),
                       NJD_SET_ACCENT_PHRASE_SAHEN_SETSUZOKU) == 0)
                     NJDNode_set_chain_flag(node, 1);
               }
            }

         /* Rule 13 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0) {
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0 ||
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0 ||
                strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_KEIYOUDOUSHI_GOKAN) == 0)
               NJDNode_set_chain_flag(node, 0);
         }

         /* Rule 14 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KIGOU) == 0 ||
             strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KIGOU) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 15 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_SETTOUSHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 16 */
         if (strcmp(NJDNode_get_pos_group3(node->prev), NJD_SET_ACCENT_PHRASE_SEI) == 0
             && strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 17 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0
             && strcmp(NJDNode_get_pos_group3(node), NJD_SET_ACCENT_PHRASE_MEI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 18 */
         if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_SETSUBI) == 0)
            NJDNode_set_chain_flag(node, 1);
      }
   }
}